

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall SGParser::Generator::Lex::CheckForErrorAndReport(Lex *this,char *message,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined1 local_118 [8];
  va_list argList;
  ParseMessage msg;
  String messageStr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  String local_40;
  
  if (in_AL != '\0') {
    local_198 = in_XMM0_Qa;
    local_188 = in_XMM1_Qa;
    local_178 = in_XMM2_Qa;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  if (((this->Messages).Flags & 1) != 0) {
    argList[0].overflow_arg_area = local_1c8;
    argList[0]._0_8_ = &stack0x00000008;
    local_118._0_4_ = 0x10;
    local_118._4_4_ = 0x30;
    local_1b8 = in_RDX;
    local_1b0 = in_RCX;
    local_1a8 = in_R8;
    local_1a0 = in_R9;
    StringWithVAFormat<char>
              ((String *)((long)&msg.FileName.field_2 + 8),message,(__va_list_tag *)local_118);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40);
    local_50._M_local_buf[0] = '\0';
    messageStr.field_2._8_8_ = &local_50;
    ParseMessage::ParseMessage
              ((ParseMessage *)&argList[0].reg_save_area,ErrorMessage,&local_40,
               (String *)((long)&msg.FileName.field_2 + 8),0,0xffffffffffffffff,0xffffffffffffffff,
               (String *)((long)&messageStr.field_2 + 8),0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)messageStr.field_2._8_8_ != &local_50) {
      operator_delete((void *)messageStr.field_2._8_8_,
                      CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    ParseMessageBuffer::AddMessage(&this->Messages,(ParseMessage *)&argList[0].reg_save_area);
    if ((size_type *)msg.Offset != &msg.FileName._M_string_length) {
      operator_delete((void *)msg.Offset,msg.FileName._M_string_length + 1);
    }
    if ((size_type *)msg.Name.field_2._8_8_ != &msg.Message._M_string_length) {
      operator_delete((void *)msg.Name.field_2._8_8_,msg.Message._M_string_length + 1);
    }
    if ((size_type *)msg._0_8_ != &msg.Name._M_string_length) {
      operator_delete((void *)msg._0_8_,msg.Name._M_string_length + 1);
    }
    if ((size_type *)msg.FileName.field_2._8_8_ != &messageStr._M_string_length) {
      operator_delete((void *)msg.FileName.field_2._8_8_,messageStr._M_string_length + 1);
    }
  }
  return;
}

Assistant:

void Lex::CheckForErrorAndReport(const char* message...) {
    if (Messages.GetMessageFlags() & ParseMessageBuffer::MessageError) {
        va_list argList;
        va_start(argList, message);
        const auto messageStr = StringWithVAFormat(message, argList);
        va_end(argList);

        const ParseMessage msg{ParseMessage::ErrorMessage, "", messageStr};
        Messages.AddMessage(msg);
    }
}